

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

xcb_generic_iterator_t
xcb_input_device_resolution_state_end(xcb_input_device_resolution_state_iterator_t i)

{
  long lVar1;
  xcb_generic_iterator_t xVar2;
  undefined8 in_RSI;
  xcb_input_device_resolution_state_iterator_t *in_RDI;
  long in_FS_OFFSET;
  xcb_generic_iterator_t ret;
  undefined4 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while (local_20 = (int)in_RSI, 0 < local_20) {
    xcb_input_device_resolution_state_next(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    xVar2._8_8_ = in_RSI;
    xVar2.data = in_RDI;
    return xVar2;
  }
  __stack_chk_fail();
}

Assistant:

xcb_generic_iterator_t
xcb_input_device_resolution_state_end (xcb_input_device_resolution_state_iterator_t i)
{
    xcb_generic_iterator_t ret;
    while(i.rem > 0)
        xcb_input_device_resolution_state_next(&i);
    ret.data = i.data;
    ret.rem = i.rem;
    ret.index = i.index;
    return ret;
}